

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::paintEvent(QMdiSubWindow *this,QPaintEvent *paintEvent)

{
  bool bVar1;
  Int IVar2;
  QObject *pQVar3;
  QMdiSubWindowPrivate *pQVar4;
  QWidget *pQVar5;
  QWidgetPrivate *pQVar6;
  QStyle *pQVar7;
  QPaintEvent *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  int width;
  int titleBarHeight;
  int border;
  QMdiSubWindowPrivate *d;
  QStylePainter painter;
  QStyleOptionFrame frameOptions;
  int in_stack_fffffffffffffe78;
  ComplexControl in_stack_fffffffffffffe7c;
  ComplexControl in_stack_fffffffffffffe80;
  ComplexControl in_stack_fffffffffffffe84;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 uVar8;
  undefined4 in_stack_fffffffffffffe98;
  StateFlag in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  ComplexControl in_stack_fffffffffffffea4;
  QMdiSubWindowPrivate *this_00;
  QRect local_130;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 local_108 [24];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 local_d8;
  QFlagsStorageHelper<Qt::WindowType,_4> local_d0;
  QFlagsStorageHelper<Qt::WindowType,_4> local_cc;
  undefined1 local_c8 [64];
  undefined4 local_88;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = QObject::parent((QObject *)0x635a15);
  uVar8 = true;
  if (pQVar3 != (QObject *)0x0) {
    local_d0.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QWidget::windowFlags
                   ((QWidget *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    local_cc.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)
                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    in_stack_fffffffffffffe7c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_cc);
    uVar8 = IVar2 != 0;
  }
  if ((bool)uVar8 != false) {
    QWidget::paintEvent((QWidget *)in_RDI,in_RSI);
    goto LAB_00635f26;
  }
  pQVar4 = d_func((QMdiSubWindow *)0x635a8d);
  bVar1 = QBasicTimer::isActive(&pQVar4->resizeTimer);
  if (bVar1) {
    bVar1 = QMdiSubWindowPrivate::hasBorder
                      ((QMdiSubWindowPrivate *)
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (QStyleOptionTitleBar *)
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    in_stack_fffffffffffffe7c = CC_SpinBox;
    if (bVar1) {
      in_stack_fffffffffffffe7c = CC_ToolButton;
    }
    in_stack_fffffffffffffea0 =
         QMdiSubWindowPrivate::titleBarHeight
                   ((QMdiSubWindowPrivate *)
                    CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                    (QStyleOptionTitleBar *)CONCAT17(uVar8,in_stack_fffffffffffffe90));
    bVar1 = QWidget::isMinimized((QWidget *)in_RDI);
    in_stack_fffffffffffffe84 = in_stack_fffffffffffffe7c;
    if (bVar1) {
      in_stack_fffffffffffffe84 = in_stack_fffffffffffffe7c << 1;
    }
    in_stack_fffffffffffffea0 = in_stack_fffffffffffffea0 - in_stack_fffffffffffffe84;
    in_stack_fffffffffffffe80 = in_stack_fffffffffffffe7c;
    in_stack_fffffffffffffea4 = in_stack_fffffffffffffe7c;
    QWidget::width((QWidget *)0x635b3b);
    QRect::QRect((QRect *)in_RDI,in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
    (pQVar4->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.x1 =
         (Representation)(undefined4)local_e0;
    (pQVar4->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.y1 =
         (Representation)local_e0._4_4_;
    (pQVar4->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.x2 =
         (Representation)(undefined4)local_d8;
    (pQVar4->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.y2 =
         (Representation)local_d8._4_4_;
    bVar1 = QString::isEmpty((QString *)0x635b93);
    if (!bVar1) {
      pQVar7 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_f0 = (**(code **)(*(long *)pQVar7 + 0xd8))
                           (pQVar7,5,&pQVar4->cachedStyleOptions,0x100,in_RDI);
      in_stack_fffffffffffffe9c =
           QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      QFontMetrics::elidedText((QString *)local_108,(int)pQVar4 + 0x408,(int)pQVar4 + 0x3b8,1);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      QString::~QString((QString *)0x635c4d);
    }
  }
  else {
    QMdiSubWindowPrivate::titleBarOptions(this_00);
    QStyleOptionTitleBar::operator=
              ((QStyleOptionTitleBar *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
               ,(QStyleOptionTitleBar *)
                CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QStyleOptionTitleBar::~QStyleOptionTitleBar
              ((QStyleOptionTitleBar *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
              );
  }
  local_120 = &DAT_aaaaaaaaaaaaaaaa;
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_110 = &DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter
            ((QStylePainter *)CONCAT17(uVar8,in_stack_fffffffffffffe90),(QWidget *)in_RDI);
  memset(local_c8,0xaa,0x50);
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x635cde);
  QStyleOption::initFrom
            ((QStyleOption *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (QWidget *)CONCAT17(uVar8,in_stack_fffffffffffffe90));
  QFlags<QStyle::StateFlag>::setFlag
            ((QFlags<QStyle::StateFlag> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c
             ,SUB41((uint)in_stack_fffffffffffffe98 >> 0x18,0));
  bVar1 = QWidget::isMaximized((QWidget *)in_RDI);
  if (bVar1) {
    bVar1 = QMdiSubWindowPrivate::drawTitleBarWhenMaximized(in_RDI);
    if (bVar1) goto LAB_00635d99;
    bVar1 = QWidget::autoFillBackground
                      ((QWidget *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    if (!bVar1) {
      pQVar5 = widget((QMdiSubWindow *)0x635d4c);
      if (pQVar5 != (QWidget *)0x0) {
        widget((QMdiSubWindow *)0x635d5c);
        pQVar6 = qt_widget_private((QWidget *)0x635d64);
        if ((*(uint *)&pQVar6->field_0x250 >> 0x11 & 1) != 0) goto LAB_00635f0f;
      }
      QStylePainter::drawPrimitive
                ((QStylePainter *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe7c,(QStyleOption *)0x635d8c);
    }
  }
  else {
LAB_00635d99:
    bVar1 = QString::isEmpty((QString *)0x635daa);
    if (!bVar1) {
      QPainter::setFont((QFont *)&local_120);
    }
    QStylePainter::drawComplexControl
              ((QStylePainter *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe7c,(QStyleOptionComplex *)0x635ddf);
    bVar1 = QWidget::isMinimized((QWidget *)in_RDI);
    if (bVar1) {
      bVar1 = QMdiSubWindowPrivate::hasBorder
                        ((QMdiSubWindowPrivate *)
                         CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (QStyleOptionTitleBar *)
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      if (!bVar1) goto LAB_00635f0f;
    }
    pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                           );
    local_88 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x2c,0,in_RDI);
    bVar1 = QWidget::isMinimized((QWidget *)in_RDI);
    if (!bVar1) {
      bVar1 = QMdiSubWindowPrivate::hasBorder
                        ((QMdiSubWindowPrivate *)
                         CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (QStyleOptionTitleBar *)
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      if (!bVar1) {
        QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        QMdiSubWindowPrivate::titleBarHeight
                  ((QMdiSubWindowPrivate *)
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   (QStyleOptionTitleBar *)CONCAT17(uVar8,in_stack_fffffffffffffe90));
        local_130 = QRect::adjusted((QRect *)this_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                    (int)((ulong)pQVar4 >> 0x20),(int)pQVar4);
        QPainter::setClipRect((QRect *)&local_120,(ClipOperation)&local_130);
      }
    }
    bVar1 = QWidget::isMinimized((QWidget *)in_RDI);
    if (bVar1) {
      bVar1 = QMdiSubWindowPrivate::hasBorder
                        ((QMdiSubWindowPrivate *)
                         CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (QStyleOptionTitleBar *)
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      if (!bVar1) goto LAB_00635f0f;
    }
    QStylePainter::drawPrimitive
              ((QStylePainter *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe7c,(QStyleOption *)0x635f07);
  }
LAB_00635f0f:
  QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x635f1c);
  QStylePainter::~QStylePainter((QStylePainter *)0x635f26);
LAB_00635f26:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::paintEvent(QPaintEvent *paintEvent)
{
    if (!parent() || (windowFlags() & Qt::FramelessWindowHint)) {
        QWidget::paintEvent(paintEvent);
        return;
    }

    Q_D(QMdiSubWindow);

    if (d->resizeTimer.isActive()) {
        // Only update the style option rect and the window title.
        int border = d->hasBorder(d->cachedStyleOptions) ? 4 : 0;
        int titleBarHeight = d->titleBarHeight(d->cachedStyleOptions);
        titleBarHeight -= isMinimized() ? 2 * border : border;
        d->cachedStyleOptions.rect = QRect(border, border, width() - 2 * border, titleBarHeight);
        if (!d->windowTitle.isEmpty()) {
            int width = style()->subControlRect(QStyle::CC_TitleBar, &d->cachedStyleOptions,
                                                QStyle::SC_TitleBarLabel, this).width();
            d->cachedStyleOptions.text = d->cachedStyleOptions.fontMetrics
                                         .elidedText(d->windowTitle, Qt::ElideRight, width);
        }
    } else {
        // Force full update.
        d->cachedStyleOptions = d->titleBarOptions();
    }

    QStylePainter painter(this);
    QStyleOptionFrame frameOptions;
    frameOptions.initFrom(this);
    frameOptions.state.setFlag(QStyle::State_Active, d->isActive);
    if (isMaximized() && !d->drawTitleBarWhenMaximized()) {
        if (!autoFillBackground() && (!widget() || !qt_widget_private(widget())->isOpaque)) {
            // make sure we paint all pixels of a maximized QMdiSubWindow if no-one else does
            painter.drawPrimitive(QStyle::PE_FrameWindow, frameOptions);
        }
        return;
    }

    if (!d->windowTitle.isEmpty())
        painter.setFont(d->font);
    painter.drawComplexControl(QStyle::CC_TitleBar, d->cachedStyleOptions);

    if (isMinimized() && !d->hasBorder(d->cachedStyleOptions))
        return;

    frameOptions.lineWidth = style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, this);

    // ### Ensure that we do not require setting the cliprect for 4.4
    if (!isMinimized() && !d->hasBorder(d->cachedStyleOptions))
        painter.setClipRect(rect().adjusted(0, d->titleBarHeight(d->cachedStyleOptions), 0, 0));
    if (!isMinimized() || d->hasBorder(d->cachedStyleOptions))
        painter.drawPrimitive(QStyle::PE_FrameWindow, frameOptions);
}